

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiply.hpp
# Opt level: O2

unsigned_long
duckdb::MultiplyOperatorOverflowCheck::Operation<unsigned_long,unsigned_long,unsigned_long>
          (unsigned_long left,unsigned_long right)

{
  bool bVar1;
  OutOfRangeException *this;
  PhysicalType type;
  allocator local_a9;
  unsigned_long result;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  bVar1 = TryMultiplyOperator::Operation<unsigned_long,unsigned_long,unsigned_long>
                    (left,right,&result);
  if (bVar1) {
    return result;
  }
  this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_40,"Overflow in multiplication of %s (%s * %s)!",&local_a9);
  TypeIdToString_abi_cxx11_(&local_60,(duckdb *)0x8,type);
  ::std::__cxx11::to_string(&local_80,left);
  ::std::__cxx11::to_string(&local_a0,right);
  OutOfRangeException::
  OutOfRangeException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (this,&local_40,&local_60,&local_80,&local_a0);
  __cxa_throw(this,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static inline TR Operation(TA left, TB right) {
		TR result;
		if (!TryMultiplyOperator::Operation(left, right, result)) {
			throw OutOfRangeException("Overflow in multiplication of %s (%s * %s)!", TypeIdToString(GetTypeId<TA>()),
			                          NumericHelper::ToString(left), NumericHelper::ToString(right));
		}
		return result;
	}